

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O0

void __thiscall bloaty::dwarf::DIEReader::SkipChildren(DIEReader *this,CU *cu,Abbrev *abbrev)

{
  int iVar1;
  Abbrev *pAVar2;
  long in_RDX;
  CU *in_RSI;
  DIEReader *in_RDI;
  int target_depth;
  anon_class_1_0_00000001 *in_stack_00000048;
  Abbrev *in_stack_00000050;
  CU *in_stack_00000058;
  DIEReader *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffe0;
  DIEReader *this_00;
  
  if ((*(byte *)(in_RDX + 6) & 1) != 0) {
    iVar1 = in_RDI->depth_ + -1;
    this_00 = in_RDI;
    SkipNullEntries((DIEReader *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    while ((iVar1 < in_RDI->depth_ && (pAVar2 = ReadCode(this_00,in_RSI), pAVar2 != (Abbrev *)0x0)))
    {
      ReadAttributes<bloaty::dwarf::DIEReader::SkipChildren(bloaty::dwarf::CU_const&,bloaty::dwarf::AbbrevTable::Abbrev_const*)::__0>
                (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
      SkipNullEntries((DIEReader *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    }
  }
  return;
}

Assistant:

void DIEReader::SkipChildren(const CU& cu, const AbbrevTable::Abbrev* abbrev) {
  if (!abbrev->has_child) {
    return;
  }

  int target_depth = depth_ - 1;
  SkipNullEntries();
  while (depth_ > target_depth) {
    // TODO(haberman): use DW_AT_sibling to optimize skipping when it is
    // available.
    abbrev = ReadCode(cu);
    if (!abbrev) {
      return;
    }
    ReadAttributes(cu, abbrev, [](uint16_t, dwarf::AttrValue) {});
    SkipNullEntries();
  }
}